

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBCore.c
# Opt level: O0

Vec_Int_t * Bmc_ManBCoreCollect(Gia_Man_t *p,int iFrame,int iOut,sat_solver *pSat)

{
  uint uVar1;
  uint uVar2;
  uint iVar1;
  Vec_Int_t *pVVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  Vec_Int_t *t;
  Vec_Int_t *vRoots2;
  Vec_Int_t *vRoots;
  Vec_Int_t *vNodes;
  int nNodesOld;
  int iObj;
  int i;
  int f;
  Gia_Obj_t *pObj;
  sat_solver *pSat_local;
  int iOut_local;
  int iFrame_local;
  Gia_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  vRoots2 = Vec_IntAlloc(100);
  t = Vec_IntAlloc(100);
  if ((iFrame < 0) || (iOut < 0)) {
    __assert_fail("iFrame >= 0 && iOut >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBCore.c"
                  ,0x7c,"Vec_Int_t *Bmc_ManBCoreCollect(Gia_Man_t *, int, int, sat_solver *)");
  }
  Vec_IntPush(p_00,-1);
  Vec_IntPush(p_00,-1);
  pGVar6 = Gia_ManPo(p,iOut);
  Bmc_ManBCoreAssignVar(p,pGVar6,iFrame,p_00);
  pGVar6 = Gia_ManPo(p,iOut);
  iVar4 = Gia_ObjId(p,pGVar6);
  Vec_IntPush(vRoots2,iVar4);
  iObj = iFrame;
  do {
    pVVar3 = vRoots2;
    if (iObj < 0) {
      nNodesOld = 0;
      while( true ) {
        iVar4 = Vec_IntSize(vRoots2);
        bVar7 = false;
        if (nNodesOld < iVar4) {
          iVar4 = Vec_IntEntry(vRoots2,nNodesOld);
          _i = Gia_ManObj(p,iVar4);
          bVar7 = _i != (Gia_Obj_t *)0x0;
        }
        if (!bVar7) break;
        uVar1 = _i->Value;
        iVar4 = Vec_IntSize(p_00);
        iVar4 = Abc_Lit2Var(iVar4);
        sat_solver_add_constraint(pSat,uVar1,iVar4,1);
        _i = Gia_ObjRiToRo(p,_i);
        Bmc_ManBCoreAssignVar(p,_i,-1,p_00);
        nNodesOld = nNodesOld + 1;
      }
      Vec_IntFree(vRoots2);
      Vec_IntFree(t);
      return p_00;
    }
    Gia_ManIncrementTravId(p);
    pGVar6 = Gia_ManConst0(p);
    Gia_ObjSetTravIdCurrent(p,pGVar6);
    pGVar6 = Gia_ManConst0(p);
    Bmc_ManBCoreAssignVar(p,pGVar6,iObj,p_00);
    pGVar6 = Gia_ManConst0(p);
    sat_solver_add_const(pSat,pGVar6->Value,1);
    Vec_IntClear(t);
    iVar4 = Vec_IntSize(p_00);
    nNodesOld = 0;
    while( true ) {
      iVar5 = Vec_IntSize(vRoots2);
      bVar7 = false;
      if (nNodesOld < iVar5) {
        iVar5 = Vec_IntEntry(vRoots2,nNodesOld);
        _i = Gia_ManObj(p,iVar5);
        bVar7 = _i != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar5 = Gia_ObjFaninId0p(p,_i);
      Bmc_ManBCoreCollect_rec(p,iVar5,iObj,p_00,t);
      nNodesOld = nNodesOld + 1;
    }
    if (iObj == iFrame) {
      _i = Gia_ManPo(p,iOut);
      if (_i->Value != 1) {
        __assert_fail("pObj->Value == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBCore.c"
                      ,0x94,"Vec_Int_t *Bmc_ManBCoreCollect(Gia_Man_t *, int, int, sat_solver *)");
      }
      pGVar6 = Gia_ObjFanin0(_i);
      if (pGVar6->Value != 3) {
        __assert_fail("Gia_ObjFanin0(pObj)->Value == 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBCore.c"
                      ,0x95,"Vec_Int_t *Bmc_ManBCoreCollect(Gia_Man_t *, int, int, sat_solver *)");
      }
      pGVar6 = Gia_ObjFanin0(_i);
      uVar1 = pGVar6->Value;
      uVar2 = _i->Value;
      iVar5 = Gia_ObjFaninC0(_i);
      sat_solver_add_constraint(pSat,uVar1,uVar2,iVar5);
    }
    else {
      nNodesOld = 0;
      while( true ) {
        iVar5 = Vec_IntSize(vRoots2);
        bVar7 = false;
        if (nNodesOld < iVar5) {
          iVar5 = Vec_IntEntry(vRoots2,nNodesOld);
          _i = Gia_ManObj(p,iVar5);
          bVar7 = _i != (Gia_Obj_t *)0x0;
        }
        if (!bVar7) break;
        uVar1 = _i->Value;
        pGVar6 = Gia_ObjFanin0(_i);
        uVar2 = pGVar6->Value;
        iVar5 = Gia_ObjFaninC0(_i);
        sat_solver_add_buffer(pSat,uVar1,uVar2,iVar5);
        nNodesOld = nNodesOld + 1;
      }
    }
    nNodesOld = 0;
    while( true ) {
      iVar5 = Vec_IntSize(t);
      bVar7 = false;
      if (nNodesOld < iVar5) {
        iVar5 = Vec_IntEntry(t,nNodesOld);
        _i = Gia_ManObj(p,iVar5);
        bVar7 = _i != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      pGVar6 = Gia_ObjRiToRo(p,_i);
      _i->Value = pGVar6->Value;
      nNodesOld = nNodesOld + 1;
    }
    while (nNodesOld = iVar4, iVar4 = Vec_IntSize(p_00), nNodesOld < iVar4) {
      iVar4 = Vec_IntEntry(p_00,nNodesOld);
      _i = Gia_ManObj(p,iVar4);
      iVar4 = Gia_ObjIsCi(_i);
      if (iVar4 == 0) {
        iVar4 = Gia_ObjIsAnd(_i);
        if (iVar4 == 0) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBCore.c"
                        ,0xa7,"Vec_Int_t *Bmc_ManBCoreCollect(Gia_Man_t *, int, int, sat_solver *)")
          ;
        }
        uVar1 = _i->Value;
        pGVar6 = Gia_ObjFanin0(_i);
        uVar2 = pGVar6->Value;
        pGVar6 = Gia_ObjFanin1(_i);
        iVar1 = pGVar6->Value;
        iVar4 = Gia_ObjFaninC0(_i);
        iVar5 = Gia_ObjFaninC1(_i);
        sat_solver_add_and(pSat,uVar1,uVar2,iVar1,iVar4,iVar5,0);
      }
      iVar4 = nNodesOld + 2;
    }
    vRoots2 = t;
    t = pVVar3;
    iObj = iObj + -1;
  } while( true );
}

Assistant:

Vec_Int_t * Bmc_ManBCoreCollect( Gia_Man_t * p, int iFrame, int iOut, sat_solver * pSat )
{
    Gia_Obj_t * pObj; 
    int f, i, iObj, nNodesOld;
    Vec_Int_t * vNodes  = Vec_IntAlloc( 100 );
    Vec_Int_t * vRoots  = Vec_IntAlloc( 100 );
    Vec_Int_t * vRoots2 = Vec_IntAlloc( 100 );
    assert( iFrame >= 0 && iOut >= 0 );
    // add first variables
    Vec_IntPush( vNodes, -1 );
    Vec_IntPush( vNodes, -1 );
    Bmc_ManBCoreAssignVar( p, Gia_ManPo(p, iOut), iFrame, vNodes );
    // start with root node
    Vec_IntPush( vRoots, Gia_ObjId(p, Gia_ManPo(p, iOut)) );
    // iterate through time frames
    for ( f = iFrame; f >= 0; f-- )
    {
        Gia_ManIncrementTravId( p );
        // add constant node
        Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
        Bmc_ManBCoreAssignVar( p, Gia_ManConst0(p), f, vNodes );
        sat_solver_add_const( pSat, Gia_ManConst0(p)->Value, 1 );
        // collect nodes in this timeframe
        Vec_IntClear( vRoots2 );
        nNodesOld = Vec_IntSize(vNodes);
        Gia_ManForEachObjVec( vRoots, p, pObj, i )
            Bmc_ManBCoreCollect_rec( p, Gia_ObjFaninId0p(p, pObj), f, vNodes, vRoots2 );
        if ( f == iFrame )
        {
            // add the final clause
            pObj = Gia_ManPo(p, iOut);
            assert( pObj->Value == 1 );
            assert( Gia_ObjFanin0(pObj)->Value == 3 );
//            sat_solver_add_const( pSat, Gia_ObjFanin0(pObj)->Value, Gia_ObjFaninC0(pObj) );
            sat_solver_add_constraint( pSat, Gia_ObjFanin0(pObj)->Value, pObj->Value, Gia_ObjFaninC0(pObj) );
        }
        else
        {
            // connect current RIs to previous ROs
            Gia_ManForEachObjVec( vRoots, p, pObj, i )
                sat_solver_add_buffer( pSat, pObj->Value, Gia_ObjFanin0(pObj)->Value, Gia_ObjFaninC0(pObj) );
        }
        Gia_ManForEachObjVec( vRoots2, p, pObj, i )
            pObj->Value = Gia_ObjRiToRo(p, pObj)->Value;
        // add nodes of this timeframe
        Vec_IntForEachEntryStart( vNodes, iObj, i, nNodesOld )
        {
            pObj = Gia_ManObj(p, iObj); i++;
            if ( Gia_ObjIsCi(pObj) )
                continue;
            assert( Gia_ObjIsAnd(pObj) );
            sat_solver_add_and( pSat, pObj->Value, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value, Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 );
        }
        // collect constant node
        ABC_SWAP( Vec_Int_t *, vRoots, vRoots2 );
    }
    // add constraint variables for the init state
    Gia_ManForEachObjVec( vRoots, p, pObj, i )
    {
        sat_solver_add_constraint( pSat, pObj->Value, Abc_Lit2Var(Vec_IntSize(vNodes)), 1 );
        pObj = Gia_ObjRiToRo(p, pObj);
        Bmc_ManBCoreAssignVar( p, pObj, -1, vNodes );
    }
    Vec_IntFree( vRoots );
    Vec_IntFree( vRoots2 );
    return vNodes;
}